

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

int count_users(OBJ_DATA *obj)

{
  CHAR_DATA *pCVar1;
  int iVar2;
  CHAR_DATA **ppCVar3;
  
  if (obj->in_room == (ROOM_INDEX_DATA *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    ppCVar3 = &obj->in_room->people;
    while (pCVar1 = *ppCVar3, pCVar1 != (CHAR_DATA *)0x0) {
      iVar2 = iVar2 + (uint)(pCVar1->on == obj);
      ppCVar3 = &pCVar1->next_in_room;
    }
  }
  return iVar2;
}

Assistant:

int count_users(OBJ_DATA *obj)
{
	CHAR_DATA *fch;
	int count = 0;

	if (obj->in_room == nullptr)
		return 0;

	for (fch = obj->in_room->people; fch != nullptr; fch = fch->next_in_room)
	{
		if (fch->on == obj)
			count++;
	}

	return count;
}